

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSupp_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x16a,
                      "void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *, int, Vec_Int_t *)");
      }
      iVar1 = Gia_ObjFaninId0p(p,pObj_00);
      Gia_ObjComputeTruth6CisSupport_rec(p,iVar1,vSupp);
      iVar1 = Gia_ObjFaninId1p(p,pObj_00);
      Gia_ObjComputeTruth6CisSupport_rec(p,iVar1,vSupp);
    }
    else {
      Vec_IntPushOrder(vSupp,iObj);
    }
  }
  return;
}

Assistant:

void Gia_ObjComputeTruth6CisSupport_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushOrder( vSupp, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId0p(p, pObj), vSupp );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId1p(p, pObj), vSupp );
}